

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesOverclockGetControlPendingValue
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,double *pValue
          )

{
  zes_pfnOverclockGetControlPendingValue_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnOverclockGetControlPendingValue_t pfnGetControlPendingValue;
  double *pValue_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Overclock).pfnGetControlPendingValue;
    if (p_Var1 == (zes_pfnOverclockGetControlPendingValue_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDomainHandle_local._4_4_ = (*p_Var1)(hDomainHandle,DomainControl,pValue);
    }
  }
  else {
    hDomainHandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDomainHandle_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesOverclockGetControlPendingValue(
    zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
    zes_overclock_control_t DomainControl,          ///< [in] Overclock Control.
    double* pValue                                  ///< [out] Returns the pending value for a given control. The units and
                                                    ///< format of the value depend on the control type.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnOverclockGetControlPendingValue_t pfnGetControlPendingValue = [&result] {
        auto pfnGetControlPendingValue = ze_lib::context->zesDdiTable.load()->Overclock.pfnGetControlPendingValue;
        if( nullptr == pfnGetControlPendingValue ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetControlPendingValue;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetControlPendingValue( hDomainHandle, DomainControl, pValue );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetControlPendingValue = ze_lib::context->zesDdiTable.load()->Overclock.pfnGetControlPendingValue;
    if( nullptr == pfnGetControlPendingValue ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetControlPendingValue( hDomainHandle, DomainControl, pValue );
    #endif
}